

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemoryRegion_conflict *
memory_map_tricore(uc_struct_conflict15 *uc,hwaddr begin,size_t size,uint32_t perms)

{
  MemoryRegion *mr;
  MemoryRegion_conflict *mr_00;
  
  mr_00 = (MemoryRegion_conflict *)g_malloc(0xa0);
  memory_region_init_ram_tricore(uc,mr_00,size,perms);
  if ((mr_00->addr == 0xffffffffffffffff) || (mr_00->ram_block == (RAMBlock *)0x0)) {
    g_free(mr_00);
    mr_00 = (MemoryRegion_conflict *)0x0;
  }
  else {
    mr = uc->system_memory;
    mr_00->priority = uc->snapshot_level;
    memory_region_add_subregion_common((MemoryRegion_conflict *)mr,begin,mr_00);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_tricore(uc->cpu);
    }
  }
  return mr_00;
}

Assistant:

MemoryRegion *memory_map(struct uc_struct *uc, hwaddr begin, size_t size, uint32_t perms)
{
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    memory_region_init_ram(uc, ram, size, perms);
    if (ram->addr == -1 || !ram->ram_block) {
        // out of memory
        g_free(ram);
        return NULL;
    }

    memory_region_add_subregion_overlap(uc->system_memory, begin, ram, uc->snapshot_level);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    return ram;
}